

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter.c
# Opt level: O1

void av1_tf_info_filtering(TEMPORAL_FILTER_INFO *tf_info,AV1_COMP *cpi,GF_GROUP *gf_group)

{
  int filter_frame_lookahead_idx;
  long lVar1;
  bool bVar2;
  
  if ((tf_info->is_temporal_filter_on != 0) && (0 < gf_group->size)) {
    lVar1 = 0;
    do {
      if ((gf_group->update_type[lVar1] == '\x03') || (gf_group->update_type[lVar1] == '\0')) {
        bVar2 = gf_group->frame_type[lVar1] == '\x01';
        filter_frame_lookahead_idx =
             (uint)gf_group->cur_frame_idx[lVar1] + (uint)gf_group->arf_src_offset[lVar1];
        if ((tf_info->tf_buf_valid[bVar2] == 0) ||
           (tf_info->tf_buf_display_index_offset[bVar2] != filter_frame_lookahead_idx)) {
          av1_temporal_filter(cpi,filter_frame_lookahead_idx,(int)lVar1,tf_info->frame_diff + bVar2,
                              tf_info->tf_buf + bVar2);
          aom_extend_frame_borders_c
                    (tf_info->tf_buf + bVar2,
                     (uint)(((cpi->common).seq_params)->monochrome == '\0') * 2 + 1);
          tf_info->tf_buf_gf_index[bVar2] = (int)lVar1;
          tf_info->tf_buf_display_index_offset[bVar2] = filter_frame_lookahead_idx;
          tf_info->tf_buf_valid[bVar2] = 1;
        }
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 < gf_group->size);
  }
  return;
}

Assistant:

void av1_tf_info_filtering(TEMPORAL_FILTER_INFO *tf_info, AV1_COMP *cpi,
                           const GF_GROUP *gf_group) {
  if (tf_info->is_temporal_filter_on == 0) return;
  const AV1_COMMON *const cm = &cpi->common;
  for (int gf_index = 0; gf_index < gf_group->size; ++gf_index) {
    int update_type = gf_group->update_type[gf_index];
    if (update_type == KF_UPDATE || update_type == ARF_UPDATE) {
      int buf_idx = gf_group->frame_type[gf_index] == INTER_FRAME;
      int lookahead_idx = gf_group->arf_src_offset[gf_index] +
                          gf_group->cur_frame_idx[gf_index];
      // This function is designed to be called multiple times after
      // av1_tf_info_reset(). It will only generate the filtered frame that does
      // not exist yet.
      if (tf_info->tf_buf_valid[buf_idx] == 0 ||
          tf_info->tf_buf_display_index_offset[buf_idx] != lookahead_idx) {
        YV12_BUFFER_CONFIG *out_buf = &tf_info->tf_buf[buf_idx];
        av1_temporal_filter(cpi, lookahead_idx, gf_index,
                            &tf_info->frame_diff[buf_idx], out_buf);
        aom_extend_frame_borders(out_buf, av1_num_planes(cm));
        tf_info->tf_buf_gf_index[buf_idx] = gf_index;
        tf_info->tf_buf_display_index_offset[buf_idx] = lookahead_idx;
        tf_info->tf_buf_valid[buf_idx] = 1;
      }
    }
  }
}